

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

aiString * __thiscall
Assimp::FBX::FBXConverter::GetTexturePath
          (aiString *__return_storage_ptr__,FBXConverter *this,Texture *tex)

{
  ulong __n;
  bool bVar1;
  uint uVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  uint unaff_EBP;
  Video *media;
  
  __return_storage_ptr__->length = 0;
  __return_storage_ptr__->data[0] = '\0';
  memset(__return_storage_ptr__->data + 1,0x1b,0x3ff);
  __n = (tex->relativeFileName)._M_string_length;
  if (__n < 0x400) {
    __return_storage_ptr__->length = (ai_uint32)__n;
    memcpy(__return_storage_ptr__->data,(tex->relativeFileName)._M_dataplus._M_p,__n);
    __return_storage_ptr__->data[__n] = '\0';
  }
  media = tex->media;
  if (media == (Video *)0x0) {
    return __return_storage_ptr__;
  }
  iVar3 = std::
          _Rb_tree<const_Assimp::FBX::Video_*,_std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>,_std::_Select1st<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
          ::find(&(this->textures_converted)._M_t,&media);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->textures_converted)._M_t._M_impl.super__Rb_tree_header) {
    if (media->contentLength == 0) {
      bVar1 = false;
      goto LAB_00160242;
    }
    unaff_EBP = ConvertVideo(this,media);
    pmVar4 = std::
             map<const_Assimp::FBX::Video_*,_unsigned_int,_std::less<const_Assimp::FBX::Video_*>,_std::allocator<std::pair<const_Assimp::FBX::Video_*const,_unsigned_int>_>_>
             ::operator[](&this->textures_converted,&media);
    *pmVar4 = unaff_EBP;
  }
  else {
    unaff_EBP = *(uint *)&iVar3._M_node[1]._M_parent;
  }
  bVar1 = true;
LAB_00160242:
  if ((bVar1) && (this->doc->settings->useLegacyEmbeddedTextureNaming != false)) {
    __return_storage_ptr__->data[0] = '*';
    uVar2 = ASSIMP_itoa10(__return_storage_ptr__->data + 1,0x3ff,unaff_EBP);
    __return_storage_ptr__->length = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

aiString FBXConverter::GetTexturePath(const Texture* tex)
        {
            aiString path;
            path.Set(tex->RelativeFilename());

            const Video* media = tex->Media();
            if (media != nullptr) {
                bool textureReady = false; //tells if our texture is ready (if it was loaded or if it was found)
                unsigned int index;

                VideoMap::const_iterator it = textures_converted.find(media);
                if (it != textures_converted.end()) {
                    index = (*it).second;
                    textureReady = true;
                }
                else {
                    if (media->ContentLength() > 0) {
                        index = ConvertVideo(*media);
                        textures_converted[media] = index;
                        textureReady = true;
                    }
                }

                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture), if the texture is ready
                if (doc.Settings().useLegacyEmbeddedTextureNaming) {
                    if (textureReady) {
                        // TODO: check the possibility of using the flag "AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING"
                        // In FBX files textures are now stored internally by Assimp with their filename included
                        // Now Assimp can lookup through the loaded textures after all data is processed
                        // We need to load all textures before referencing them, as FBX file format order may reference a texture before loading it
                        // This may occur on this case too, it has to be studied
                        path.data[0] = '*';
                        path.length = 1 + ASSIMP_itoa10(path.data + 1, MAXLEN - 1, index);
                    }
                }
            }

            return path;
        }